

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.cpp
# Opt level: O0

void trt_pose::parse::assignment_out
               (int *connections,float *score_graph,int count_a,int count_b,int M,
               float score_threshold,void *workspace)

{
  bool bVar1;
  int local_9c;
  int local_98;
  int j_1;
  int i_1;
  undefined1 local_88 [8];
  PairGraph star_graph;
  int local_48;
  int idx;
  int j;
  int i;
  float *cost_graph;
  int ncols;
  int nrows;
  void *workspace_local;
  float score_threshold_local;
  int M_local;
  int count_b_local;
  int count_a_local;
  float *score_graph_local;
  int *connections_local;
  
  for (idx = 0; idx < count_a; idx = idx + 1) {
    for (local_48 = 0; local_48 < count_b; local_48 = local_48 + 1) {
      star_graph.cols.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = idx * M + local_48;
      *(float *)((long)workspace +
                (long)star_graph.cols.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_ * 4) =
           -score_graph
            [star_graph.cols.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_];
    }
  }
  utils::PairGraph::PairGraph((PairGraph *)local_88,count_a,count_b);
  _munkres((float *)workspace,M,(PairGraph *)local_88,count_a,count_b);
  for (local_98 = 0; local_98 < count_a; local_98 = local_98 + 1) {
    for (local_9c = 0; local_9c < count_b; local_9c = local_9c + 1) {
      bVar1 = utils::PairGraph::isPair((PairGraph *)local_88,local_98,local_9c);
      if ((bVar1) && (score_threshold < score_graph[local_98 * M + local_9c])) {
        connections[local_98] = local_9c;
        connections[M + local_9c] = local_98;
      }
    }
  }
  utils::PairGraph::~PairGraph((PairGraph *)local_88);
  return;
}

Assistant:

void assignment_out(int *connections,         // 2xM
                    const float *score_graph, // MxM
                    const int count_a, const int count_b, const int M,
                    const float score_threshold, void *workspace) {
  const int nrows = count_a;
  const int ncols = count_b;

  // compute cost graph (negate score graph)
  float *cost_graph = (float *)workspace;
  for (int i = 0; i < count_a; i++) {
    for (int j = 0; j < count_b; j++) {
      const int idx = i * M + j;
      cost_graph[idx] = -score_graph[idx];
    }
  }

  // run munkres algorithm
  auto star_graph = PairGraph(nrows, ncols);
  _munkres(cost_graph, M, star_graph, nrows, ncols);

  // fill output connections
  for (int i = 0; i < nrows; i++) {
    for (int j = 0; j < ncols; j++) {
      if (star_graph.isPair(i, j) && score_graph[i * M + j] > score_threshold) {
        connections[0 * M + i] = j;
        connections[1 * M + j] = i;
      }
    }
  }
}